

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

RenderBatch *
rlLoadRenderBatch(RenderBatch *__return_storage_ptr__,int numBuffers,int bufferElements)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  VertexBuffer *pVVar8;
  float *pfVar9;
  uchar *puVar10;
  uint *puVar11;
  uint **ppuVar12;
  ulong uVar13;
  DrawCall *pDVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  __return_storage_ptr__->draws = (DrawCall *)0x0;
  __return_storage_ptr__->drawsCounter = 0;
  __return_storage_ptr__->currentDepth = 0.0;
  __return_storage_ptr__->buffersCount = 0;
  __return_storage_ptr__->currentBuffer = 0;
  __return_storage_ptr__->vertexBuffer = (VertexBuffer *)0x0;
  pVVar8 = (VertexBuffer *)malloc((long)numBuffers * 0x48);
  __return_storage_ptr__->vertexBuffer = pVVar8;
  if (0 < numBuffers) {
    uVar3 = bufferElements * 0xc;
    uVar5 = bufferElements * 8;
    uVar6 = bufferElements * 0x10;
    iVar4 = bufferElements * 6;
    uVar1 = uVar5;
    if ((int)uVar5 < 2) {
      uVar1 = 1;
    }
    uVar2 = 1;
    if (1 < (int)uVar6) {
      uVar2 = uVar6;
    }
    iVar7 = 6;
    if (6 < iVar4) {
      iVar7 = iVar4;
    }
    uVar13 = 0;
    do {
      pVVar8[uVar13].elementsCount = bufferElements;
      pfVar9 = (float *)malloc((long)(int)uVar3 << 2);
      pVVar8[uVar13].vertices = pfVar9;
      pfVar9 = (float *)malloc((long)(int)uVar5 * 4);
      pVVar8[uVar13].texcoords = pfVar9;
      puVar10 = (uchar *)malloc((long)(int)uVar6);
      pVVar8[uVar13].colors = puVar10;
      puVar11 = (uint *)malloc((long)iVar4 * 4);
      pVVar8[uVar13].indices = puVar11;
      if (0 < (int)uVar3) {
        uVar16 = 0;
        do {
          pVVar8[uVar13].vertices[uVar16] = 0.0;
          uVar16 = uVar16 + 1;
        } while (uVar3 != uVar16);
      }
      if (0 < bufferElements) {
        uVar16 = 0;
        do {
          pVVar8[uVar13].texcoords[uVar16] = 0.0;
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
      }
      if (0 < bufferElements) {
        uVar16 = 0;
        do {
          pVVar8[uVar13].colors[uVar16] = '\0';
          uVar16 = uVar16 + 1;
        } while (uVar2 != uVar16);
      }
      if (0 < bufferElements) {
        ppuVar12 = &pVVar8[uVar13].indices;
        uVar15 = 3;
        lVar17 = 0;
        do {
          (*ppuVar12)[lVar17] = uVar15 - 3;
          (*ppuVar12)[lVar17 + 1] = uVar15 - 2;
          (*ppuVar12)[lVar17 + 2] = uVar15 - 1;
          (*ppuVar12)[lVar17 + 3] = uVar15 - 3;
          (*ppuVar12)[lVar17 + 4] = uVar15 - 1;
          (*ppuVar12)[lVar17 + 5] = uVar15;
          lVar17 = lVar17 + 6;
          uVar15 = uVar15 + 4;
        } while ((int)(((ulong)(iVar7 - 2) + 1) / 6) * 6 + 6 != (int)lVar17);
      }
      pVVar8[uVar13].vCounter = 0;
      pVVar8[uVar13].tcCounter = 0;
      pVVar8[uVar13].cCounter = 0;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)numBuffers);
  }
  TraceLog(3,"RLGL: Render batch vertex buffers loaded successfully in RAM (CPU)");
  if (0 < numBuffers) {
    lVar17 = 0;
    do {
      if (RLGL.ExtSupported.vao == true) {
        (*glad_glGenVertexArrays)(1,(GLuint *)((long)pVVar8->vboId + lVar17 + -4));
        (*glad_glBindVertexArray)(*(GLuint *)((long)pVVar8->vboId + lVar17 + -4));
      }
      (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar8->vboId + lVar17));
      (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)pVVar8->vboId + lVar17));
      (*glad_glBufferData)
                (0x8892,(long)(bufferElements * 0xc) << 2,
                 *(void **)((long)pVVar8->vboId + lVar17 + -0x24),0x88e8);
      (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShader.locs);
      (*glad_glVertexAttribPointer)(*RLGL.State.currentShader.locs,3,0x1406,'\0',0,(void *)0x0);
      (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar8->vboId + lVar17 + 4));
      (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)pVVar8->vboId + lVar17 + 4));
      (*glad_glBufferData)
                (0x8892,(long)(bufferElements * 8) << 2,
                 *(void **)((long)pVVar8->vboId + lVar17 + -0x1c),0x88e8);
      (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[1]);
      (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[1],2,0x1406,'\0',0,(void *)0x0);
      (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar8->vboId + lVar17 + 8));
      (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)pVVar8->vboId + lVar17 + 8));
      (*glad_glBufferData)
                (0x8892,(long)(bufferElements << 4),*(void **)((long)pVVar8->vboId + lVar17 + -0x14)
                 ,0x88e8);
      (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[5]);
      (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[5],4,0x1401,'\x01',0,(void *)0x0);
      (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar8->vboId + lVar17 + 0xc));
      (*glad_glBindBuffer)(0x8893,*(GLuint *)((long)pVVar8->vboId + lVar17 + 0xc));
      (*glad_glBufferData)
                (0x8893,(long)(bufferElements * 6) << 2,
                 *(void **)((long)pVVar8->vboId + lVar17 + -0xc),0x88e4);
      lVar17 = lVar17 + 0x48;
    } while ((ulong)(uint)numBuffers * 0x48 != lVar17);
  }
  TraceLog(3,"RLGL: Render batch vertex buffers loaded successfully in VRAM (GPU)");
  if (RLGL.ExtSupported.vao != false) {
    (*glad_glBindVertexArray)(0);
  }
  pDVar14 = (DrawCall *)malloc(0x1000);
  __return_storage_ptr__->draws = pDVar14;
  uVar1 = RLGL.State.defaultTextureId;
  lVar17 = 0;
  do {
    *(undefined8 *)((long)&pDVar14->mode + lVar17) = 7;
    *(undefined4 *)((long)&pDVar14->vertexAlignment + lVar17) = 0;
    *(uint *)((long)&pDVar14->textureId + lVar17) = uVar1;
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x1000);
  __return_storage_ptr__->buffersCount = numBuffers;
  __return_storage_ptr__->drawsCounter = 1;
  __return_storage_ptr__->currentDepth = -1.0;
  return __return_storage_ptr__;
}

Assistant:

RenderBatch rlLoadRenderBatch(int numBuffers, int bufferElements)
{
    RenderBatch batch = { 0 };

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Initialize CPU (RAM) vertex buffers (position, texcoord, color data and indexes)
    //--------------------------------------------------------------------------------------------
    batch.vertexBuffer = (VertexBuffer *)RL_MALLOC(sizeof(VertexBuffer)*numBuffers);

    for (int i = 0; i < numBuffers; i++)
    {
        batch.vertexBuffer[i].elementsCount = bufferElements;

        batch.vertexBuffer[i].vertices = (float *)RL_MALLOC(bufferElements*3*4*sizeof(float));        // 3 float by vertex, 4 vertex by quad
        batch.vertexBuffer[i].texcoords = (float *)RL_MALLOC(bufferElements*2*4*sizeof(float));       // 2 float by texcoord, 4 texcoord by quad
        batch.vertexBuffer[i].colors = (unsigned char *)RL_MALLOC(bufferElements*4*4*sizeof(unsigned char));   // 4 float by color, 4 colors by quad
#if defined(GRAPHICS_API_OPENGL_33)
        batch.vertexBuffer[i].indices = (unsigned int *)RL_MALLOC(bufferElements*6*sizeof(unsigned int));      // 6 int by quad (indices)
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
        batch.vertexBuffer[i].indices = (unsigned short *)RL_MALLOC(bufferElements*6*sizeof(unsigned short));  // 6 int by quad (indices)
#endif

        for (int j = 0; j < (3*4*bufferElements); j++) batch.vertexBuffer[i].vertices[j] = 0.0f;
        for (int j = 0; j < (2*4*bufferElements); j++) batch.vertexBuffer[i].texcoords[j] = 0.0f;
        for (int j = 0; j < (4*4*bufferElements); j++) batch.vertexBuffer[i].colors[j] = 0;

        int k = 0;

        // Indices can be initialized right now
        for (int j = 0; j < (6*bufferElements); j += 6)
        {
            batch.vertexBuffer[i].indices[j] = 4*k;
            batch.vertexBuffer[i].indices[j + 1] = 4*k + 1;
            batch.vertexBuffer[i].indices[j + 2] = 4*k + 2;
            batch.vertexBuffer[i].indices[j + 3] = 4*k;
            batch.vertexBuffer[i].indices[j + 4] = 4*k + 2;
            batch.vertexBuffer[i].indices[j + 5] = 4*k + 3;

            k++;
        }

        batch.vertexBuffer[i].vCounter = 0;
        batch.vertexBuffer[i].tcCounter = 0;
        batch.vertexBuffer[i].cCounter = 0;
    }

    TRACELOG(LOG_INFO, "RLGL: Render batch vertex buffers loaded successfully in RAM (CPU)");
    //--------------------------------------------------------------------------------------------

    // Upload to GPU (VRAM) vertex data and initialize VAOs/VBOs
    //--------------------------------------------------------------------------------------------
    for (int i = 0; i < numBuffers; i++)
    {
        if (RLGL.ExtSupported.vao)
        {
            // Initialize Quads VAO
            glGenVertexArrays(1, &batch.vertexBuffer[i].vaoId);
            glBindVertexArray(batch.vertexBuffer[i].vaoId);
        }

        // Quads - Vertex buffers binding and attributes enable
        // Vertex position buffer (shader-location = 0)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[0]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[0]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*3*4*sizeof(float), batch.vertexBuffer[i].vertices, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);

        // Vertex texcoord buffer (shader-location = 1)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[1]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[1]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*2*4*sizeof(float), batch.vertexBuffer[i].texcoords, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);

        // Vertex color buffer (shader-location = 3)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[2]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[2]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*4*4*sizeof(unsigned char), batch.vertexBuffer[i].colors, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);

        // Fill index buffer
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[3]);
        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[3]);
#if defined(GRAPHICS_API_OPENGL_33)
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, bufferElements*6*sizeof(int), batch.vertexBuffer[i].indices, GL_STATIC_DRAW);
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, bufferElements*6*sizeof(short), batch.vertexBuffer[i].indices, GL_STATIC_DRAW);
#endif
    }

    TRACELOG(LOG_INFO, "RLGL: Render batch vertex buffers loaded successfully in VRAM (GPU)");

    // Unbind the current VAO
    if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    //--------------------------------------------------------------------------------------------

    // Init draw calls tracking system
    //--------------------------------------------------------------------------------------------
    batch.draws = (DrawCall *)RL_MALLOC(DEFAULT_BATCH_DRAWCALLS*sizeof(DrawCall));

    for (int i = 0; i < DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch.draws[i].mode = RL_QUADS;
        batch.draws[i].vertexCount = 0;
        batch.draws[i].vertexAlignment = 0;
        //batch.draws[i].vaoId = 0;
        //batch.draws[i].shaderId = 0;
        batch.draws[i].textureId = RLGL.State.defaultTextureId;
        //batch.draws[i].RLGL.State.projection = MatrixIdentity();
        //batch.draws[i].RLGL.State.modelview = MatrixIdentity();
    }

    batch.buffersCount = numBuffers;    // Record buffer count
    batch.drawsCounter = 1;             // Reset draws counter
    batch.currentDepth = -1.0f;         // Reset depth value
    //--------------------------------------------------------------------------------------------
#endif

    return batch;
}